

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall
Board::draw_board(Board *this,set<Point,_std::less<Point>,_std::allocator<Point>_> *options,
                 Color color,uint turn)

{
  bool bVar1;
  uint uVar2;
  shared_ptr<Piece> *__a;
  __shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  uchar foreground;
  uchar local_13d;
  uchar local_13b;
  uchar local_139;
  short local_fa;
  Point local_f8;
  dimension y_1;
  string local_f0;
  _Self local_d0;
  Point local_c4;
  _Self local_c0;
  _Self local_b8;
  Point local_ac;
  _Self local_a8;
  allocator<char> local_99;
  string local_98;
  Point local_72;
  short local_6e;
  dimension j;
  short local_5a;
  undefined1 local_58 [6];
  dimension i;
  set<Point,_std::less<Point>,_std::allocator<Point>_> threatened;
  uchar background;
  dimension y;
  uint turn_local;
  Color color_local;
  set<Point,_std::less<Point>,_std::allocator<Point>_> *options_local;
  Board *this_local;
  
  std::operator<<((ostream *)&std::cout,"  ");
  for (threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ = 0;
      threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ < 8;
      threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ =
           threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ + 1) {
    print_char_index((char)threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ + 'A');
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  get_threatened((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_58,this,color & WHITE
                 ,turn);
  for (local_5a = 7; -1 < local_5a; local_5a = local_5a + -1) {
    print_index(local_5a + 1);
    for (local_6e = 0; local_6e < 8; local_6e = local_6e + 1) {
      Point::Point(&local_72,local_6e,local_5a);
      __a = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,&local_72);
      bVar1 = std::operator==(__a,(nullptr_t)0x0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"  ",&local_99);
        uVar2 = (int)local_5a + (int)local_6e;
        print_colorful(&local_98,'\0',
                       (uVar2 != (uVar2 - ((int)uVar2 >> 0x1f) & 0xfffffffe)) * '\x02' + 0xf3);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
      }
      else {
        Point::Point(&local_ac,local_6e,local_5a);
        local_a8._M_node =
             (_Base_ptr)
             std::set<Point,_std::less<Point>,_std::allocator<Point>_>::find(options,&local_ac);
        local_b8._M_node =
             (_Base_ptr)std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end(options);
        bVar1 = std::operator!=(&local_a8,&local_b8);
        if (bVar1) {
          Point::Point(&local_c4,local_6e,local_5a);
          local_c0._M_node =
               (_Base_ptr)
               std::set<Point,_std::less<Point>,_std::allocator<Point>_>::find
                         ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_58,&local_c4
                         );
          local_d0._M_node =
               (_Base_ptr)
               std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end
                         ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_58);
          bVar1 = std::operator!=(&local_c0,&local_d0);
          if (bVar1) {
            local_139 = 0xa0;
            if (((int)local_5a + (int)local_6e) % 2 == 0) {
              local_139 = '|';
            }
            threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = local_139;
          }
          else {
            local_13b = '\"';
            if (((int)local_5a + (int)local_6e) % 2 == 0) {
              local_13b = '\x1c';
            }
            threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = local_13b;
          }
        }
        else {
          local_13d = 0xf5;
          if (((int)local_5a + (int)local_6e) % 2 == 0) {
            local_13d = 0xf3;
          }
          threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = local_13d;
        }
        Point::Point((Point *)&stack0xffffffffffffff0c,local_6e,local_5a);
        p_Var3 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[]
                           (&this->m_board,(Point *)&stack0xffffffffffffff0c);
        peVar4 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        (*peVar4->_vptr_Piece[3])(&local_f0);
        Point::Point(&local_f8,local_6e,local_5a);
        p_Var3 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,&local_f8)
        ;
        peVar4 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        uVar2 = (*peVar4->_vptr_Piece[4])();
        foreground = '\0';
        if ((uVar2 & 1) != 0) {
          foreground = 0xff;
        }
        print_colorful(&local_f0,foreground,
                       threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_);
        std::__cxx11::string::~string((string *)&local_f0);
      }
    }
    print_index(local_5a + 1);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"  ");
  for (local_fa = 0; local_fa < 8; local_fa = local_fa + 1) {
    print_char_index((char)local_fa + 'A');
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::set<Point,_std::less<Point>,_std::allocator<Point>_>::~set
            ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_58);
  return;
}

Assistant:

void Board::draw_board(const set<Point> &options, Color color, unsigned int turn) const {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(color, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", 0, ((i + j) % 2 ? colors::light_gray : colors::dark_gray));
                continue;
            }
#if DISPLAY_HINTS
            if ((options.find({j, i}) != options.end())) {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
#endif // DISPLAY_HINTS
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
#if DISPLAY_HINTS
            } else {
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
            }
#endif // DISPLAY_HINTS
            print_colorful(m_board[{j, i}]->get_representation(),
                           (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
        }
        print_index(i + 1);
        cout << endl;
    }

    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
}

void Board::draw_board(const set<Point> &possible_moves, const map<Point, play> &possible_plays, const Point &chosen,
                       unsigned int turn) {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(possible_moves, possible_plays, chosen, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (Point(j, i) == chosen) {
                background = 220;
#if DISPLAY_HINTS
            } else if ((possible_moves.find({j, i}) == possible_moves.end())) {
#else
                }
#endif // DISPLAY_HINTS
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
#if DISPLAY_HINTS
            } else {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
            }
#endif // DISPLAY_HINTS

            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", colors::black, background);
            } else {
                print_colorful(m_board[{j, i}]->get_representation(),
                               (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
            }
        }
        print_index(i + 1);
        cout << endl;
    }

    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
}